

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int ncnn::reduction_post_process<ncnn::post_process_identity<float>>(Mat *a,float coeff,Option *opt)

{
  int iVar1;
  float *pfVar2;
  Mat *in_RDI;
  float in_XMM0_Da;
  float fVar3;
  int i_3;
  float *outptr;
  int q;
  int i_2;
  int size_1;
  int c;
  int i_1;
  int size;
  int i;
  int w;
  int dims;
  post_process_identity<float> mathop;
  float *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int local_8c;
  Mat local_88;
  float *local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined4 local_20;
  post_process_identity<float> local_19 [13];
  float local_c;
  Mat *local_8;
  
  iVar1 = in_RDI->dims;
  local_c = in_XMM0_Da;
  local_8 = in_RDI;
  if (iVar1 == 1) {
    local_24 = in_RDI->w;
    local_20 = 1;
    for (local_28 = 0; local_28 < local_24; local_28 = local_28 + 1) {
      pfVar2 = Mat::operator[](local_8,(long)local_28);
      fVar3 = post_process_identity<float>::operator()(local_19,pfVar2);
      fVar3 = fVar3 * local_c;
      pfVar2 = Mat::operator[](local_8,(long)local_28);
      *pfVar2 = fVar3;
    }
  }
  else if (iVar1 == 2) {
    local_2c = in_RDI->w * in_RDI->h;
    local_20 = 2;
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      pfVar2 = Mat::operator[](local_8,(long)local_30);
      fVar3 = post_process_identity<float>::operator()(local_19,pfVar2);
      fVar3 = fVar3 * local_c;
      pfVar2 = Mat::operator[](local_8,(long)local_30);
      *pfVar2 = fVar3;
    }
  }
  else if (iVar1 == 3) {
    local_34 = in_RDI->c;
    local_38 = in_RDI->w * in_RDI->h;
    if (local_34 == 1) {
      local_20 = 3;
      local_34 = 1;
      for (local_3c = 0; local_3c < local_38; local_3c = local_3c + 1) {
        pfVar2 = Mat::operator[](local_8,(long)local_3c);
        fVar3 = post_process_identity<float>::operator()(local_19,pfVar2);
        fVar3 = fVar3 * local_c;
        pfVar2 = Mat::operator[](local_8,(long)local_3c);
        *pfVar2 = fVar3;
      }
    }
    else {
      local_20 = 3;
      for (local_40 = 0; local_40 < local_34; local_40 = local_40 + 1) {
        Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                     (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
        in_stack_ffffffffffffff60 = Mat::operator_cast_to_float_(&local_88);
        Mat::~Mat((Mat *)0x15db17);
        local_48 = in_stack_ffffffffffffff60;
        for (local_8c = 0; local_8c < local_38; local_8c = local_8c + 1) {
          fVar3 = post_process_identity<float>::operator()(local_19,local_48 + local_8c);
          local_48[local_8c] = fVar3 * local_c;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int reduction_post_process(Mat& a, float coeff, const Option& opt)
{
    MathOp mathop;

    int dims = a.dims;
    if (dims == 1)
    {
        int w = a.w;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<w; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 2)
    {
        int size = a.w * a.h;
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=0; i<size; i++)
            a[i] = mathop(a[i]) * coeff;
    }
    else if (dims == 3)
    {
        int c = a.c;
        int size = a.w * a.h;
        if(c == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i=0; i<size; i++)
                a[i] = mathop(a[i]) * coeff;
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for(int q=0; q<c; q++)
            {
                float* outptr = a.channel(q);
                for (int i=0; i<size; i++)
                    outptr[i] = mathop(outptr[i]) * coeff;
            }
        }
    }
    
    return 0;
}